

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

void __thiscall httplib::ThreadPool::enqueue(ThreadPool *this,function<void_()> *fn)

{
  size_t *psVar1;
  _Node *p_Var2;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_28;
  
  local_28._M_device = &this->mutex_;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  p_Var2 = std::__cxx11::list<std::function<void()>,std::allocator<std::function<void()>>>::
           _M_create_node<std::function<void()>const&>
                     ((list<std::function<void()>,std::allocator<std::function<void()>>> *)
                      &this->jobs_,fn);
  std::__detail::_List_node_base::_M_hook(&p_Var2->super__List_node_base);
  psVar1 = &(this->jobs_).
            super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  std::condition_variable::notify_one();
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void enqueue(std::function<void()> fn) override {
    std::unique_lock<std::mutex> lock(mutex_);
    jobs_.push_back(fn);
    cond_.notify_one();
  }